

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O3

void __thiscall xercesc_4_0::SGXMLScanner::resizeElemState(SGXMLScanner *this)

{
  long lVar1;
  MemoryManager *pMVar2;
  uint *puVar3;
  uint *puVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  uint *puVar8;
  ulong uVar9;
  uint *puVar7;
  undefined4 extraout_var_00;
  
  uVar5 = this->fElemStateSize * 2;
  pMVar2 = (this->super_XMLScanner).fMemoryManager;
  lVar1 = (ulong)uVar5 * 4;
  iVar6 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,lVar1);
  puVar7 = (uint *)CONCAT44(extraout_var,iVar6);
  pMVar2 = (this->super_XMLScanner).fMemoryManager;
  iVar6 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,lVar1);
  puVar8 = (uint *)CONCAT44(extraout_var_00,iVar6);
  if (this->fElemStateSize == 0) {
    uVar9 = 0;
  }
  else {
    puVar3 = this->fElemState;
    puVar4 = this->fElemLoopState;
    uVar9 = 0;
    do {
      puVar7[uVar9] = puVar3[uVar9];
      puVar8[uVar9] = puVar4[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar9 < this->fElemStateSize);
  }
  if ((uint)uVar9 < uVar5) {
    uVar9 = uVar9 & 0xffffffff;
    do {
      puVar7[uVar9] = 0;
      puVar8[uVar9] = 0;
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
  pMVar2 = (this->super_XMLScanner).fMemoryManager;
  (*pMVar2->_vptr_MemoryManager[4])(pMVar2,this->fElemState);
  pMVar2 = (this->super_XMLScanner).fMemoryManager;
  (*pMVar2->_vptr_MemoryManager[4])(pMVar2,this->fElemLoopState);
  this->fElemState = puVar7;
  this->fElemLoopState = puVar8;
  this->fElemStateSize = uVar5;
  return;
}

Assistant:

void SGXMLScanner::resizeElemState() {

    unsigned int newSize = fElemStateSize * 2;
    unsigned int* newElemState = (unsigned int*) fMemoryManager->allocate
    (
        newSize * sizeof(unsigned int)
    ); //new unsigned int[newSize];
    unsigned int* newElemLoopState = (unsigned int*) fMemoryManager->allocate
    (
        newSize * sizeof(unsigned int)
    ); //new unsigned int[newSize];

    // Copy the existing values
    unsigned int index = 0;
    for (; index < fElemStateSize; index++)
    {
        newElemState[index] = fElemState[index];
        newElemLoopState[index] = fElemLoopState[index];
    }

    for (; index < newSize; index++)
        newElemLoopState[index] = newElemState[index] = 0;

    // Delete the old array and udpate our members
    fMemoryManager->deallocate(fElemState); //delete [] fElemState;
    fMemoryManager->deallocate(fElemLoopState); //delete [] fElemLoopState;
    fElemState = newElemState;
    fElemLoopState = newElemLoopState;
    fElemStateSize = newSize;
}